

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O2

uint crnlib::get_ogl_type_size(uint32 ogl_type)

{
  uint uVar1;
  
  uVar1 = ogl_type - 0x1400;
  if (uVar1 < 0xc) {
    if ((0x70U >> (uVar1 & 0x1f) & 1) != 0) {
      return 4;
    }
    if ((0x80cU >> (uVar1 & 0x1f) & 1) != 0) {
      return 2;
    }
    if ((3U >> (uVar1 & 0x1f) & 1) != 0) {
      return 1;
    }
  }
  if ((ogl_type - 0x8363 < 4) || (ogl_type - 0x8033 < 2)) {
    return 2;
  }
  if ((1 < ogl_type - 0x8035) && (1 < ogl_type - 0x8367)) {
    if ((ogl_type == 0x8032) || (ogl_type == 0x8362)) {
      return 1;
    }
    if (((ogl_type != 0x84fa) && (ogl_type != 0x8c3b)) && (ogl_type != 0x8c3e)) {
      return 0;
    }
  }
  return 4;
}

Assistant:

uint get_ogl_type_size(uint32 ogl_type)
    {
        switch (ogl_type)
        {
        case KTX_UNSIGNED_BYTE:
        case KTX_BYTE:
            return 1;
        case KTX_HALF_FLOAT:
        case KTX_UNSIGNED_SHORT:
        case KTX_SHORT:
            return 2;
        case KTX_FLOAT:
        case KTX_UNSIGNED_INT:
        case KTX_INT:
            return 4;
        case KTX_UNSIGNED_BYTE_3_3_2:
        case KTX_UNSIGNED_BYTE_2_3_3_REV:
            return 1;
        case KTX_UNSIGNED_SHORT_5_6_5:
        case KTX_UNSIGNED_SHORT_5_6_5_REV:
        case KTX_UNSIGNED_SHORT_4_4_4_4:
        case KTX_UNSIGNED_SHORT_4_4_4_4_REV:
        case KTX_UNSIGNED_SHORT_5_5_5_1:
        case KTX_UNSIGNED_SHORT_1_5_5_5_REV:
            return 2;
        case KTX_UNSIGNED_INT_8_8_8_8:
        case KTX_UNSIGNED_INT_8_8_8_8_REV:
        case KTX_UNSIGNED_INT_10_10_10_2:
        case KTX_UNSIGNED_INT_2_10_10_10_REV:
        case KTX_UNSIGNED_INT_24_8:
        case KTX_UNSIGNED_INT_10F_11F_11F_REV:
        case KTX_UNSIGNED_INT_5_9_9_9_REV:
            return 4;
        }
        return 0;
    }